

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Fl_Window_Type::moveallchildren(Fl_Window_Type *this)

{
  int iVar1;
  Fl_Widget_Type *myo;
  Fl_Widget_Type *myo_00;
  Fl_Widget_Type *myo2;
  Fl_Widget_Type *myo_01;
  Fl_Type *tt;
  int T;
  int R;
  int Y;
  int X;
  int t;
  int r;
  int y;
  int x;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  undo_checkpoint();
  myo_00 = (Fl_Widget_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
  if (myo_00 != (Fl_Widget_Type *)0x0) {
    do {
      if ((myo_00->super_Fl_Type).level <= (this->super_Fl_Widget_Type).super_Fl_Type.level) break;
      if ((((myo_00->super_Fl_Type).selected == '\0') ||
          (iVar1 = (*(myo_00->super_Fl_Type)._vptr_Fl_Type[0x17])(myo_00), iVar1 == 0)) ||
         (iVar1 = (*(myo_00->super_Fl_Type)._vptr_Fl_Type[0x1e])(myo_00), iVar1 != 0)) {
        myo_01 = (Fl_Widget_Type *)(myo_00->super_Fl_Type).next;
      }
      else {
        newposition(this,myo_00,&local_34,&local_38,&local_3c,&local_40);
        (*myo_00->o->_vptr_Fl_Widget[4])();
        for (myo_01 = (Fl_Widget_Type *)(myo_00->super_Fl_Type).next;
            (myo_01 != (Fl_Widget_Type *)0x0 &&
            ((myo_00->super_Fl_Type).level < (myo_01->super_Fl_Type).level));
            myo_01 = (Fl_Widget_Type *)(myo_01->super_Fl_Type).next) {
          iVar1 = (*(myo_01->super_Fl_Type)._vptr_Fl_Type[0x17])(myo_01);
          if ((iVar1 != 0) &&
             (iVar1 = (*(myo_01->super_Fl_Type)._vptr_Fl_Type[0x1e])(myo_01), iVar1 == 0)) {
            newposition(this,myo_01,&local_44,&local_48,&local_4c,&local_50);
            (*myo_01->o->_vptr_Fl_Widget[4])();
          }
        }
      }
      myo_00 = myo_01;
    } while (myo_00 != (Fl_Widget_Type *)0x0);
  }
  for (tt = (this->super_Fl_Widget_Type).super_Fl_Type.next;
      (tt != (Fl_Type *)0x0 && ((this->super_Fl_Widget_Type).super_Fl_Type.level < tt->level));
      tt = tt->next) {
    fix_group_size(tt);
  }
  Fl_Widget::redraw((this->super_Fl_Widget_Type).o);
  this->recalc = 1;
  Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)(this->super_Fl_Widget_Type).o);
  set_modflag(1);
  this->dx = 0;
  this->dy = 0;
  update_xywh();
  return;
}

Assistant:

void Fl_Window_Type::moveallchildren()
{
  undo_checkpoint();
  Fl_Type *i;
  for (i=next; i && i->level>level;) {
    if (i->selected && i->is_widget() && !i->is_menu_item()) {
      Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
      int x,y,r,t;
      newposition(myo,x,y,r,t);
      myo->o->resize(x,y,r-x,t-y);
      // move all the children, whether selected or not:
      Fl_Type* p;
      for (p = myo->next; p && p->level>myo->level; p = p->next)
	if (p->is_widget() && !p->is_menu_item()) {
	  Fl_Widget_Type* myo2 = (Fl_Widget_Type*)p;
	  int X,Y,R,T;
	  newposition(myo2,X,Y,R,T);
	  myo2->o->resize(X,Y,R-X,T-Y);
	}
      i = p;
    } else {
      i = i->next;
    }
  }
  for (i=next; i && i->level>level; i=i->next) 
    fix_group_size(i);
  o->redraw();
  recalc = 1;
  ((Overlay_Window *)(this->o))->redraw_overlay();
  set_modflag(1);
  dx = dy = 0;

  update_xywh();
}